

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O2

ValueT * Qentem::JSON::JSONParser<char,_Qentem::StringStream<char>_>::parseArray
                   (ValueT *__return_storage_ptr__,StringStream<char> *stream,char *content,
                   SizeT *offset,SizeT length)

{
  uint uVar1;
  ulong uVar2;
  ValueT VStack_48;
  
  StringUtils::TrimLeft<char,unsigned_int>(content,offset,length);
  (__return_storage_ptr__->field_0).array_.storage_ = (Value<char> *)0x0;
  *(SizeT *)((long)&__return_storage_ptr__->field_0 + 8) = 0;
  *(SizeT *)((long)&__return_storage_ptr__->field_0 + 0xc) = 0;
  __return_storage_ptr__->type_ = Array;
  uVar1 = *offset;
  uVar2 = (ulong)uVar1;
  if (content[uVar2] != ']') {
    while ((uint)uVar2 < length) {
      parseValue(&VStack_48,stream,content,offset,length);
      Array<Qentem::Value<char>_>::operator+=
                ((Array<Qentem::Value<char>_> *)__return_storage_ptr__,&VStack_48);
      Value<char>::~Value(&VStack_48);
      StringUtils::TrimLeft<char,unsigned_int>(content,offset,length);
      uVar1 = *offset;
      if (length <= uVar1) break;
      if (content[uVar1] != ',') {
        if (content[uVar1] == ']') goto LAB_0010c7a7;
        break;
      }
      *offset = uVar1 + 1;
      StringUtils::TrimLeft<char,unsigned_int>(content,offset,length);
      uVar2 = (ulong)*offset;
    }
    Value<char>::Reset(__return_storage_ptr__);
    uVar1 = *offset;
  }
LAB_0010c7a7:
  *offset = uVar1 + 1;
  return __return_storage_ptr__;
}

Assistant:

static ValueT parseArray(Stream_T &stream, const Char_T *content, SizeT &offset, const SizeT length) {
            StringUtils::TrimLeft(content, offset, length);

            ValueT value{ValueType::Array};

            if (content[offset] != JSONotation::ESquareChar) {
                Array<ValueT> *arr = value.GetArray();

                while (offset < length) {
                    *arr += parseValue(stream, content, offset, length);
                    StringUtils::TrimLeft(content, offset, length);

                    if (offset < length) {
                        const Char_T ch = content[offset];

                        if (ch == JSONotation::CommaChar) {
                            ++offset;
                            StringUtils::TrimLeft(content, offset, length);
                            continue;
                        }

                        if (ch == JSONotation::ESquareChar) {
                            ++offset;
                            return value;
                        }
                    }

                    break;
                }

                value.Reset();
            }

            ++offset;
            return value;
        }